

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall TTD::ThreadContextTTD::~ThreadContextTTD(ThreadContextTTD *this)

{
  Recycler *this_00;
  bool bVar1;
  EntryType *pEVar2;
  undefined1 local_58 [8];
  EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  iter;
  
  iter.
  super_IteratorBase<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = &this->m_ttdContextToExternalRefMap;
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_58,
                  (BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)iter.
                     super_IteratorBase<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                     ._24_8_);
  while( true ) {
    bVar1 = JsUtil::
            BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_58);
    if (!bVar1) break;
    this_00 = this->m_threadCtx->recycler;
    pEVar2 = JsUtil::
             BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::Current((IteratorBase<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        *)local_58);
    Memory::Recycler::RootRelease
              (this_00,(pEVar2->
                       super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       ).super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
                       super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
                       .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.
                       value,(uint *)0x0);
    JsUtil::
    BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_58);
  }
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear((BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)iter.
             super_IteratorBase<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ._24_8_);
  this->m_activeContext = (ScriptContext *)0x0;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count = 0;
  JsUtil::
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdRootTagToObjectMap);
  JsUtil::
  BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdMayBeLongLivedRoot);
  if ((this->m_ttdRecordRootWeakMap).ptr !=
      (WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
       *)0x0) {
    Memory::
    RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
    ::Unroot(&this->m_ttdRecordRootWeakMap,this->m_threadCtx->recycler);
  }
  if ((this->m_ttdReplayRootPinSet).ptr !=
      (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    Memory::
    RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::Unroot(&this->m_ttdReplayRootPinSet,this->m_threadCtx->recycler);
  }
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::~RecyclerRootPtr(&this->m_ttdReplayRootPinSet);
  Memory::
  RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
  ::~RecyclerRootPtr(&this->m_ttdRecordRootWeakMap);
  JsUtil::
  BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->m_ttdMayBeLongLivedRoot);
  JsUtil::
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->m_ttdRootTagToObjectMap);
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)iter.
                       super_IteratorBase<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                       ._24_8_);
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_014e5c70;
  JsUtil::
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Reset(&this->m_contextList);
  return;
}

Assistant:

ThreadContextTTD::~ThreadContextTTD()
    {
        for(auto iter = this->m_ttdContextToExternalRefMap.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            this->m_threadCtx->GetRecycler()->RootRelease(iter.CurrentValue());
        }
        this->m_ttdContextToExternalRefMap.Clear();

        this->m_activeContext = nullptr;
        this->m_contextList.Clear();

        this->m_ttdRootTagToObjectMap.Clear();
        this->m_ttdMayBeLongLivedRoot.Clear();

        if(this->m_ttdRecordRootWeakMap != nullptr)
        {
            this->m_ttdRecordRootWeakMap.Unroot(this->m_threadCtx->GetRecycler());
        }

        if(this->m_ttdReplayRootPinSet != nullptr)
        {
            this->m_ttdReplayRootPinSet.Unroot(this->m_threadCtx->GetRecycler());
        }
    }